

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_term(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar7;
  int iVar8;
  char *cclass;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *cclass_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *cclass_01;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *cclass_02;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *cclass_03;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *cclass_04;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *cclass_05;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *cclass_06;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *cclass_07;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *cclass_08;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *cclass_09;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *cclass_10;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *cclass_11;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *cclass_12;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *cclass_13;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *cclass_14;
  char *cclass_15;
  char *extraout_RDX_29;
  char *extraout_RDX_30;
  char *cclass_16;
  char *extraout_RDX_31;
  char *extraout_RDX_32;
  char *cclass_17;
  char *extraout_RDX_33;
  char *extraout_RDX_34;
  char *cclass_18;
  char *extraout_RDX_35;
  char *extraout_RDX_36;
  char *cclass_19;
  char *cclass_20;
  char *cclass_21;
  char *cclass_22;
  char *cclass_23;
  char *extraout_RDX_37;
  char *extraout_RDX_38;
  char *cclass_24;
  char *cclass_25;
  char *cclass_26;
  char *cclass_27;
  int iVar9;
  code *pcVar10;
  char *pcVar11;
  int yypos410;
  int yythunkpos0;
  int yypos0;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  iVar8 = G->pos;
  iVar7 = G->thunkpos;
  yyText(G,G->begin,G->end);
  iVar4 = G->pos;
  iVar9 = G->thunkpos;
  G->begin = iVar4;
  iVar3 = yymatchClass(G,(uchar *)"",cclass);
  pcVar11 = extraout_RDX;
  if (iVar3 == 0) {
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar4 = yymatchChar(G,0x2e);
    if ((iVar4 != 0) &&
       (iVar4 = yymatchClass(G,(uchar *)"",cclass_01), pcVar11 = extraout_RDX_03, iVar4 != 0)) {
      do {
        iVar4 = G->pos;
        iVar9 = G->thunkpos;
        iVar3 = yymatchClass(G,(uchar *)"",pcVar11);
        pcVar11 = extraout_RDX_04;
      } while (iVar3 != 0);
      goto LAB_00108203;
    }
LAB_0010824b:
    G->pos = iVar8;
    G->thunkpos = iVar7;
    yyDo(G,yyPush,1,0,"yyPush");
    iVar4 = G->pos;
    iVar9 = G->thunkpos;
    iVar3 = yymatchString(G,"0b");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_02);
      pcVar11 = extraout_RDX_05;
      if (iVar3 == 0) goto LAB_00108307;
      do {
        iVar8 = G->pos;
        iVar7 = G->thunkpos;
        iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
        pcVar11 = extraout_RDX_06;
      } while (iVar4 != 0);
      G->pos = iVar8;
      G->thunkpos = iVar7;
      yyText(G,G->begin,G->end);
      iVar8 = G->pos;
      iVar7 = G->begin;
      G->end = iVar8;
      pcVar10 = yy_1_integer;
      pcVar11 = "yy_1_integer";
LAB_001086e1:
      yyDo(G,pcVar10,iVar7,iVar8,pcVar11);
      pcVar10 = yyPop;
      pcVar11 = "yyPop";
      iVar8 = 1;
      iVar7 = 0;
      goto LAB_00108701;
    }
LAB_00108307:
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar3 = yymatchString(G,"0d");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_03);
      pcVar11 = extraout_RDX_07;
      if (iVar3 != 0) {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
          pcVar11 = extraout_RDX_08;
        } while (iVar4 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar7 = G->begin;
        G->end = iVar8;
        pcVar10 = yy_2_integer;
        pcVar11 = "yy_2_integer";
        goto LAB_001086e1;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar3 = yymatchString(G,"0x");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_04);
      pcVar11 = extraout_RDX_09;
      if (iVar3 != 0) {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
          pcVar11 = extraout_RDX_10;
        } while (iVar4 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar7 = G->begin;
        G->end = iVar8;
        pcVar10 = yy_3_integer;
        pcVar11 = "yy_3_integer";
        goto LAB_001086e1;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar3 = yymatchString(G,"0o");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_05);
      pcVar11 = extraout_RDX_11;
      if (iVar3 != 0) {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
          pcVar11 = extraout_RDX_12;
        } while (iVar4 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar7 = G->begin;
        G->end = iVar8;
        pcVar10 = yy_4_integer;
        pcVar11 = "yy_4_integer";
        goto LAB_001086e1;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar3 = yymatchString(G,":10<");
    if (iVar3 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_06);
      pcVar11 = extraout_RDX_13;
      if (iVar3 != 0) {
        do {
          iVar3 = G->pos;
          iVar6 = G->thunkpos;
          iVar5 = yymatchClass(G,(uchar *)"",pcVar11);
          pcVar11 = extraout_RDX_14;
        } while (iVar5 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar6;
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        iVar3 = yymatchChar(G,0x3e);
        if (iVar3 != 0) {
          iVar7 = G->begin;
          iVar8 = G->end;
          pcVar10 = yy_5_integer;
          pcVar11 = "yy_5_integer";
          goto LAB_001086e1;
        }
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar4 = yymatchChar(G,0x3a);
    if (iVar4 != 0) {
      iVar4 = G->pos;
      iVar9 = G->thunkpos;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)"",cclass_07);
      pcVar11 = extraout_RDX_15;
      if (iVar3 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar9;
      }
      else {
        do {
          iVar4 = G->pos;
          iVar9 = G->thunkpos;
          iVar6 = yymatchClass(G,(uchar *)"",pcVar11);
          pcVar11 = extraout_RDX_16;
        } while (iVar6 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar9;
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        yyDo(G,yy_1_integer_int,G->begin,G->pos,"yy_1_integer_int");
      }
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar4 = yymatchChar(G,0x3c);
        if (iVar4 != 0) {
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar4 = yymatchClass(G,(uchar *)"",cclass_08);
          pcVar11 = extraout_RDX_17;
          if (iVar4 != 0) {
            do {
              iVar4 = G->pos;
              iVar9 = G->thunkpos;
              iVar3 = yymatchClass(G,(uchar *)"",pcVar11);
              pcVar11 = extraout_RDX_18;
            } while (iVar3 != 0);
            G->pos = iVar4;
            G->thunkpos = iVar9;
            yyText(G,G->begin,G->end);
            G->end = G->pos;
            iVar4 = yymatchChar(G,0x3e);
            if (iVar4 != 0) {
              iVar7 = G->begin;
              iVar8 = G->end;
              pcVar10 = yy_6_integer;
              pcVar11 = "yy_6_integer";
              goto LAB_001086e1;
            }
          }
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar7;
    iVar4 = yymatchString(G,"qp{");
    if (iVar4 != 0) {
      yyDo(G,yy_1_path,G->begin,G->end,"yy_1_path");
      iVar4 = G->pos;
      iVar9 = G->thunkpos;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2b12,cclass_09);
      pcVar11 = extraout_RDX_19;
      if (iVar3 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar9;
        iVar3 = yymatchChar(G,0x5c);
        if (iVar3 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar9;
        }
        else {
          iVar4 = yymatchChar(G,0x7d);
          if (iVar4 != 0) {
            iVar4 = G->begin;
            iVar9 = G->end;
            pcVar10 = yy_3_path;
            pcVar11 = "yy_3_path";
            goto LAB_00108814;
          }
        }
      }
      else {
        do {
          iVar4 = G->pos;
          iVar9 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2b12,pcVar11);
          pcVar11 = extraout_RDX_20;
        } while (iVar3 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar9;
        yyText(G,G->begin,G->end);
        iVar9 = G->pos;
        iVar4 = G->begin;
        G->end = iVar9;
        pcVar10 = yy_2_path;
        pcVar11 = "yy_2_path";
LAB_00108814:
        yyDo(G,pcVar10,iVar4,iVar9,pcVar11);
        do {
          iVar4 = G->pos;
          iVar9 = G->thunkpos;
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_2b12,cclass_10);
          pcVar11 = extraout_RDX_21;
          if (iVar3 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar9;
            iVar3 = yymatchChar(G,0x5c);
            if (iVar3 == 0) {
              G->pos = iVar4;
              G->thunkpos = iVar9;
            }
            else {
              iVar3 = yymatchChar(G,0x7d);
              if (iVar3 != 0) {
                yyDo(G,yy_3_path,G->begin,G->end,"yy_3_path");
                iVar3 = 0;
                goto LAB_001088fb;
              }
            }
            iVar3 = 0xc;
          }
          else {
            do {
              iVar3 = G->pos;
              iVar6 = G->thunkpos;
              iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_2b12,pcVar11);
              pcVar11 = extraout_RDX_22;
            } while (iVar5 != 0);
            G->pos = iVar3;
            G->thunkpos = iVar6;
            yyText(G,G->begin,G->end);
            G->end = G->pos;
            yyDo(G,yy_2_path,G->begin,G->pos,"yy_2_path");
            iVar3 = 0xb;
          }
LAB_001088fb:
          if (iVar3 == 0) {
LAB_00108909:
            iVar3 = 7;
          }
          else if (iVar3 == 0xc) {
            G->pos = iVar4;
            G->thunkpos = iVar9;
            iVar3 = 0;
          }
          else if (iVar3 == 0xb) goto LAB_00108909;
        } while (iVar3 != 0);
        iVar4 = yymatchChar(G,0x7d);
        iVar9 = 3;
        if (iVar4 != 0) goto LAB_0010870b;
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar7;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar4 = yymatchClass(G,(uchar *)"",cclass_11);
    pcVar11 = extraout_RDX_23;
    if (iVar4 != 0) {
      do {
        iVar4 = G->pos;
        iVar9 = G->thunkpos;
        iVar3 = yymatchClass(G,(uchar *)"",pcVar11);
        pcVar11 = extraout_RDX_24;
      } while (iVar3 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar9;
      iVar3 = yymatchChar(G,0x2e);
      if (iVar3 != 0) {
        iVar3 = yymatchClass(G,(uchar *)"",cclass_12);
        pcVar11 = extraout_RDX_25;
        while (iVar3 != 0) {
          iVar4 = G->pos;
          iVar9 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar11);
          pcVar11 = extraout_RDX_26;
        }
      }
      G->pos = iVar4;
      G->thunkpos = iVar9;
      iVar4 = yymatchChar(G,0x65);
      if (iVar4 != 0) {
        iVar9 = G->pos;
        iVar3 = G->thunkpos;
        iVar4 = yymatchChar(G,0x2d);
        iVar6 = 10;
        if (iVar4 == 0) {
          G->pos = iVar9;
          G->thunkpos = iVar3;
          iVar6 = 0;
        }
        if ((iVar6 != 10) && (iVar9 = 3, iVar6 != 0)) goto LAB_0010870b;
        iVar4 = yymatchClass(G,(uchar *)"",cclass_13);
        pcVar11 = extraout_RDX_27;
        if (iVar4 != 0) {
          do {
            iVar8 = G->pos;
            iVar7 = G->thunkpos;
            iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
            pcVar11 = extraout_RDX_28;
          } while (iVar4 != 0);
          G->pos = iVar8;
          G->thunkpos = iVar7;
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          yyDo(G,yy_1_dec_number,G->begin,G->pos,"yy_1_dec_number");
          iVar9 = 3;
          iVar4 = extraout_EAX_00;
          goto LAB_0010870b;
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar7;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar4 = yymatchClass(G,(uchar *)"",cclass_14);
    if ((iVar4 != 0) &&
       (iVar4 = yymatchClass(G,(uchar *)"",cclass_15), pcVar11 = extraout_RDX_29, iVar4 != 0)) {
      do {
        iVar8 = G->pos;
        iVar7 = G->thunkpos;
        iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
        pcVar11 = extraout_RDX_30;
      } while (iVar4 != 0);
      G->pos = iVar8;
      G->thunkpos = iVar7;
      yyText(G,G->begin,G->end);
      iVar7 = G->pos;
      iVar8 = G->begin;
      G->end = iVar7;
      pcVar10 = yy_2_dec_number;
      pcVar11 = "yy_2_dec_number";
      goto LAB_00108701;
    }
    G->pos = iVar8;
    G->thunkpos = iVar7;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar4 = yymatchClass(G,(uchar *)"",cclass_16);
    pcVar11 = extraout_RDX_31;
    if (iVar4 != 0) {
      do {
        iVar4 = G->pos;
        iVar9 = G->thunkpos;
        iVar3 = yymatchClass(G,(uchar *)"",pcVar11);
        pcVar11 = extraout_RDX_32;
      } while (iVar3 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar9;
      iVar4 = yymatchChar(G,0x2e);
      if ((iVar4 != 0) &&
         (iVar4 = yymatchClass(G,(uchar *)"",cclass_17), pcVar11 = extraout_RDX_33, iVar4 != 0)) {
        do {
          iVar8 = G->pos;
          iVar7 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
          pcVar11 = extraout_RDX_34;
        } while (iVar4 != 0);
        G->pos = iVar8;
        G->thunkpos = iVar7;
        yyText(G,G->begin,G->end);
        iVar7 = G->pos;
        iVar8 = G->begin;
        G->end = iVar7;
        pcVar10 = yy_3_dec_number;
        pcVar11 = "yy_3_dec_number";
        goto LAB_00108701;
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar7;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar4 = yymatchClass(G,(uchar *)"",cclass_18);
    pcVar11 = extraout_RDX_35;
    if (iVar4 != 0) {
      do {
        iVar8 = G->pos;
        iVar7 = G->thunkpos;
        iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
        pcVar11 = extraout_RDX_36;
      } while (iVar4 != 0);
      G->pos = iVar8;
      G->thunkpos = iVar7;
      yyText(G,G->begin,G->end);
      iVar7 = G->pos;
      iVar8 = G->begin;
      G->end = iVar7;
      pcVar10 = yy_4_dec_number;
      pcVar11 = "yy_4_dec_number";
      goto LAB_00108701;
    }
    G->pos = iVar8;
    G->thunkpos = iVar7;
    iVar4 = yy_string(G);
    if (iVar4 == 0) {
      G->pos = iVar8;
      G->thunkpos = iVar7;
      iVar4 = yymatchChar(G,0x28);
      if (iVar4 != 0) {
        do {
          iVar4 = G->pos;
          iVar9 = G->thunkpos;
          iVar3 = yy_ws(G);
        } while (iVar3 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar9;
        iVar3 = yy_loose_or_expr(G);
        if (iVar3 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar9;
        }
        else {
          yyDo(G,yySet,-3,0,"yySet");
          do {
            iVar4 = G->pos;
            iVar9 = G->thunkpos;
            iVar3 = yy_ws(G);
          } while (iVar3 != 0);
          G->pos = iVar4;
          G->thunkpos = iVar9;
          iVar4 = yymatchChar(G,0x29);
          if (iVar4 != 0) {
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar10 = yy_1_term;
            pcVar11 = "yy_1_term";
            goto LAB_00108701;
          }
        }
      }
      G->pos = iVar8;
      G->thunkpos = iVar7;
      iVar4 = yy_variable(G);
      if (iVar4 == 0) {
        G->pos = iVar8;
        G->thunkpos = iVar7;
        iVar4 = yymatchString(G,"$?LINE");
        if (iVar4 != 0) {
          iVar8 = G->begin;
          iVar7 = G->end;
          pcVar10 = yy_2_term;
          pcVar11 = "yy_2_term";
          goto LAB_00108701;
        }
        G->pos = iVar8;
        G->thunkpos = iVar7;
        iVar4 = yy_array(G);
        if (iVar4 != 0) goto LAB_00108706;
        G->pos = iVar8;
        G->thunkpos = iVar7;
        iVar4 = yy_class(G);
        if (iVar4 == 0) {
          G->pos = iVar8;
          G->thunkpos = iVar7;
          iVar4 = yy_role(G);
          if (iVar4 == 0) {
            G->pos = iVar8;
            G->thunkpos = iVar7;
            iVar4 = yy_funcall(G);
            if (iVar4 == 0) {
              G->pos = iVar8;
              G->thunkpos = iVar7;
              iVar4 = yy_qw(G);
              if (iVar4 == 0) {
                G->pos = iVar8;
                G->thunkpos = iVar7;
                iVar4 = yy_hash(G);
                if (iVar4 == 0) {
                  G->pos = iVar8;
                  G->thunkpos = iVar7;
                  iVar4 = yy_lambda(G);
                  if (iVar4 == 0) {
                    G->pos = iVar8;
                    G->thunkpos = iVar7;
                    iVar4 = yy_it_method(G);
                    if (iVar4 == 0) {
                      G->pos = iVar8;
                      G->thunkpos = iVar7;
                      iVar4 = yy_enum(G);
                      if (iVar4 == 0) {
                        G->pos = iVar8;
                        G->thunkpos = iVar7;
                        iVar4 = yymatchString(G,"pi");
                        if (iVar4 != 0) {
                          iVar3 = G->pos;
                          iVar6 = G->thunkpos;
                          iVar4 = yymatchClass(G,(uchar *)"",cclass_19);
                          iVar9 = 0x14;
                          if (iVar4 == 0) {
                            G->pos = iVar3;
                            G->thunkpos = iVar6;
                            iVar9 = 0;
                          }
                          if (iVar9 != 0x14) {
                            if (iVar9 != 0) goto LAB_0010870b;
                            iVar8 = G->begin;
                            iVar7 = G->end;
                            pcVar10 = yy_3_term;
                            pcVar11 = "yy_3_term";
                            goto LAB_00108701;
                          }
                        }
                        G->pos = iVar8;
                        G->thunkpos = iVar7;
                        iVar4 = yymatchChar(G,0x65);
                        if (iVar4 != 0) {
                          iVar3 = G->pos;
                          iVar6 = G->thunkpos;
                          iVar4 = yymatchClass(G,(uchar *)"",cclass_20);
                          iVar9 = 0x16;
                          if (iVar4 == 0) {
                            G->pos = iVar3;
                            G->thunkpos = iVar6;
                            iVar9 = 0;
                          }
                          if (iVar9 != 0x16) {
                            if (iVar9 != 0) goto LAB_0010870b;
                            iVar8 = G->begin;
                            iVar7 = G->end;
                            pcVar10 = yy_4_term;
                            pcVar11 = "yy_4_term";
                            goto LAB_00108701;
                          }
                        }
                        G->pos = iVar8;
                        G->thunkpos = iVar7;
                        iVar4 = yymatchString(G,"try");
                        if ((iVar4 == 0) || (iVar4 = yy_ws(G), iVar4 == 0)) {
LAB_00109047:
                          G->pos = iVar8;
                          G->thunkpos = iVar7;
                          iVar4 = yymatchString(G,"try");
                          if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
                            do {
                              iVar4 = G->pos;
                              iVar9 = G->thunkpos;
                              iVar3 = yy_ws(G);
                            } while (iVar3 != 0);
                            G->pos = iVar4;
                            G->thunkpos = iVar9;
                            iVar3 = yy_loose_or_expr(G);
                            if (iVar3 != 0) {
                              yyDo(G,yySet,-2,0,"yySet");
                              iVar8 = G->begin;
                              iVar7 = G->end;
                              pcVar10 = yy_6_term;
                              pcVar11 = "yy_6_term";
                              goto LAB_00109127;
                            }
                            G->pos = iVar4;
                            G->thunkpos = iVar9;
                          }
                          G->pos = iVar8;
                          G->thunkpos = iVar7;
                          iVar4 = yy_perl5_regexp(G);
                          if (iVar4 == 0) {
                            G->pos = iVar8;
                            G->thunkpos = iVar7;
                            iVar4 = yymatchString(G,"m:P5/./");
                            if (iVar4 != 0) {
                              iVar8 = G->begin;
                              iVar7 = G->end;
                              pcVar10 = yy_7_term;
                              pcVar11 = "yy_7_term";
                              goto LAB_00109127;
                            }
                            G->pos = iVar8;
                            G->thunkpos = iVar7;
                            iVar4 = yy_regexp(G);
                            if (iVar4 == 0) {
                              G->pos = iVar8;
                              G->thunkpos = iVar7;
                              iVar4 = yymatchString(G,"True");
                              if (iVar4 != 0) {
                                iVar3 = G->pos;
                                iVar6 = G->thunkpos;
                                iVar4 = yymatchClass(G,(uchar *)"",cclass_21);
                                iVar9 = 0x1f;
                                if (iVar4 == 0) {
                                  G->pos = iVar3;
                                  G->thunkpos = iVar6;
                                  iVar9 = 0;
                                }
                                if (iVar9 != 0x1f) {
                                  if (iVar9 != 0) goto LAB_0010870b;
                                  iVar8 = G->begin;
                                  iVar7 = G->end;
                                  pcVar10 = yy_8_term;
                                  pcVar11 = "yy_8_term";
                                  goto LAB_00108701;
                                }
                              }
                              G->pos = iVar8;
                              G->thunkpos = iVar7;
                              iVar4 = yymatchString(G,"False");
                              if (iVar4 != 0) {
                                iVar3 = G->pos;
                                iVar6 = G->thunkpos;
                                iVar4 = yymatchClass(G,(uchar *)"",cclass_22);
                                iVar9 = 0x21;
                                if (iVar4 == 0) {
                                  G->pos = iVar3;
                                  G->thunkpos = iVar6;
                                  iVar9 = 0;
                                }
                                if (iVar9 != 0x21) {
                                  if (iVar9 != 0) goto LAB_0010870b;
                                  iVar8 = G->begin;
                                  iVar7 = G->end;
                                  pcVar10 = yy_9_term;
                                  pcVar11 = "yy_9_term";
                                  goto LAB_00108701;
                                }
                              }
                              G->pos = iVar8;
                              G->thunkpos = iVar7;
                              iVar4 = yy_reserved(G);
                              iVar9 = 0x24;
                              if (iVar4 == 0) {
                                G->pos = iVar8;
                                G->thunkpos = iVar7;
                                iVar9 = 0;
                                iVar4 = iVar7;
                              }
                              if (iVar9 != 0x24) {
                                if (iVar9 != 0) goto LAB_0010870b;
                                iVar4 = yy_ident(G);
                                if (iVar4 != 0) goto LAB_00108eca;
                              }
                              G->pos = iVar8;
                              G->thunkpos = iVar7;
                              yyText(G,G->begin,G->end);
                              G->begin = G->pos;
                              iVar4 = yymatchString(G,"class");
                              if (iVar4 != 0) {
                                yyText(G,G->begin,G->end);
                                iVar7 = G->pos;
                                iVar8 = G->begin;
                                G->end = iVar7;
                                pcVar10 = yy_10_term;
                                pcVar11 = "yy_10_term";
                                goto LAB_00109127;
                              }
                              G->pos = iVar8;
                              G->thunkpos = iVar7;
                              iVar4 = yy_pair(G);
                              if (iVar4 == 0) {
                                G->pos = iVar8;
                                G->thunkpos = iVar7;
                                iVar4 = yymatchChar(G,0x5c);
                                if ((iVar4 != 0) && (iVar4 = yy_term(G), iVar4 != 0)) {
                                  yyDo(G,yySet,-1,0,"yySet");
                                  iVar8 = G->begin;
                                  iVar7 = G->end;
                                  pcVar10 = yy_11_term;
                                  pcVar11 = "yy_11_term";
                                  goto LAB_00109127;
                                }
                                G->pos = iVar8;
                                G->thunkpos = iVar7;
                                iVar4 = yymatchChar(G,0x28);
                                if (iVar4 != 0) {
                                  do {
                                    iVar4 = G->pos;
                                    iVar9 = G->thunkpos;
                                    iVar3 = yy_ws(G);
                                  } while (iVar3 != 0);
                                  G->pos = iVar4;
                                  G->thunkpos = iVar9;
                                  iVar4 = yymatchChar(G,0x29);
                                  if (iVar4 != 0) {
                                    iVar8 = G->begin;
                                    iVar7 = G->end;
                                    pcVar10 = yy_12_term;
                                    pcVar11 = "yy_12_term";
                                    goto LAB_00109127;
                                  }
                                }
                                G->pos = iVar8;
                                G->thunkpos = iVar7;
                                iVar4 = yy_funcref(G);
                                if (iVar4 == 0) {
                                  G->pos = iVar8;
                                  G->thunkpos = iVar7;
                                  yyText(G,G->begin,G->end);
                                  G->begin = G->pos;
                                  iVar4 = yymatchString(G,"$~");
                                  if ((iVar4 != 0) &&
                                     (iVar4 = yymatchClass(G,(uchar *)"",cclass_23),
                                     pcVar11 = extraout_RDX_37, iVar4 != 0)) {
                                    do {
                                      iVar8 = G->pos;
                                      iVar7 = G->thunkpos;
                                      iVar4 = yymatchClass(G,(uchar *)"",pcVar11);
                                      pcVar11 = extraout_RDX_38;
                                    } while (iVar4 != 0);
                                    G->pos = iVar8;
                                    G->thunkpos = iVar7;
                                    yyText(G,G->begin,G->end);
                                    iVar7 = G->pos;
                                    iVar8 = G->begin;
                                    G->end = iVar7;
                                    pcVar10 = yy_13_term;
                                    pcVar11 = "yy_13_term";
                                    goto LAB_00109127;
                                  }
                                  G->pos = iVar8;
                                  G->thunkpos = iVar7;
                                  iVar4 = yymatchChar(G,0x2a);
                                  if (iVar4 != 0) {
                                    iVar3 = G->pos;
                                    iVar6 = G->thunkpos;
                                    iVar4 = yymatchClass(G,(uchar *)"",cclass_24);
                                    iVar9 = 0x2d;
                                    if (iVar4 == 0) {
                                      G->pos = iVar3;
                                      G->thunkpos = iVar6;
                                      iVar9 = 0;
                                    }
                                    if (iVar9 != 0x2d) {
                                      if (iVar9 != 0) goto LAB_0010870b;
                                      iVar8 = G->begin;
                                      iVar7 = G->end;
                                      pcVar10 = yy_14_term;
                                      pcVar11 = "yy_14_term";
                                      goto LAB_00108701;
                                    }
                                  }
                                  G->pos = iVar8;
                                  G->thunkpos = iVar7;
                                  iVar4 = yy_attr_vars(G);
                                  if (iVar4 == 0) {
                                    G->pos = iVar8;
                                    G->thunkpos = iVar7;
                                    iVar4 = yymatchString(G,"rand");
                                    if (iVar4 != 0) {
                                      iVar3 = G->pos;
                                      iVar6 = G->thunkpos;
                                      iVar4 = yymatchClass(G,(uchar *)"",cclass_25);
                                      iVar9 = 0x30;
                                      if (iVar4 == 0) {
                                        G->pos = iVar3;
                                        G->thunkpos = iVar6;
                                        iVar9 = 0;
                                      }
                                      if (iVar9 != 0x30) {
                                        if (iVar9 != 0) goto LAB_0010870b;
                                        iVar8 = G->begin;
                                        iVar7 = G->end;
                                        pcVar10 = yy_15_term;
                                        pcVar11 = "yy_15_term";
                                        goto LAB_00108701;
                                      }
                                    }
                                    G->pos = iVar8;
                                    G->thunkpos = iVar7;
                                    iVar4 = yymatchString(G,"now");
                                    if (iVar4 != 0) {
                                      iVar3 = G->pos;
                                      iVar6 = G->thunkpos;
                                      iVar4 = yymatchClass(G,(uchar *)"",cclass_26);
                                      iVar9 = 0x32;
                                      if (iVar4 == 0) {
                                        G->pos = iVar3;
                                        G->thunkpos = iVar6;
                                        iVar9 = 0;
                                      }
                                      if (iVar9 != 0x32) {
                                        if (iVar9 != 0) goto LAB_0010870b;
                                        iVar8 = G->begin;
                                        iVar7 = G->end;
                                        pcVar10 = yy_16_term;
                                        pcVar11 = "yy_16_term";
                                        goto LAB_00108701;
                                      }
                                    }
                                    G->pos = iVar8;
                                    G->thunkpos = iVar7;
                                    iVar4 = yymatchString(G,"time");
                                    if (iVar4 != 0) {
                                      iVar3 = G->pos;
                                      iVar6 = G->thunkpos;
                                      iVar4 = yymatchClass(G,(uchar *)"",cclass_27);
                                      iVar9 = 0x34;
                                      if (iVar4 == 0) {
                                        G->pos = iVar3;
                                        G->thunkpos = iVar6;
                                        iVar9 = 0;
                                      }
                                      if (iVar9 != 0x34) {
                                        if (iVar9 != 0) goto LAB_0010870b;
                                        iVar8 = G->begin;
                                        iVar7 = G->end;
                                        pcVar10 = yy_17_term;
                                        pcVar11 = "yy_17_term";
                                        goto LAB_00108701;
                                      }
                                    }
                                    G->pos = iVar8;
                                    G->thunkpos = iVar7;
                                    yyDo(G,yy_18_term,G->begin,G->end,"yy_18_term");
                                    iVar4 = yymatchString(G,"$(");
                                    if (iVar4 != 0) {
                                      do {
                                        iVar3 = G->pos;
                                        iVar6 = G->thunkpos;
                                        iVar4 = yy_ws(G);
                                      } while (iVar4 != 0);
                                      G->pos = iVar3;
                                      G->thunkpos = iVar6;
                                      iVar4 = yy_loose_or_expr(G);
                                      if (iVar4 == 0) {
                                        G->pos = iVar3;
                                        G->thunkpos = iVar6;
                                        iVar9 = 0;
                                      }
                                      else {
                                        yyDo(G,yySet,-3,0,"yySet");
                                        do {
                                          iVar3 = G->pos;
                                          iVar6 = G->thunkpos;
                                          iVar4 = yy_ws(G);
                                        } while (iVar4 != 0);
                                        iVar9 = 0x38;
                                      }
                                      iVar4 = 0;
                                      G->pos = iVar3;
                                      G->thunkpos = iVar6;
                                      if ((iVar9 != 0x38) && (iVar9 != 0)) goto LAB_0010870b;
                                      iVar4 = yymatchChar(G,0x29);
                                      if (iVar4 != 0) {
                                        iVar8 = G->begin;
                                        iVar7 = G->end;
                                        pcVar10 = yy_19_term;
                                        pcVar11 = "yy_19_term";
                                        goto LAB_00109127;
                                      }
                                    }
                                    G->pos = iVar8;
                                    G->thunkpos = iVar7;
                                    yyDo(G,yy_20_term,G->begin,G->end,"yy_20_term");
                                    iVar4 = yymatchString(G,"@(");
                                    if (iVar4 != 0) {
                                      do {
                                        iVar3 = G->pos;
                                        iVar6 = G->thunkpos;
                                        iVar4 = yy_ws(G);
                                      } while (iVar4 != 0);
                                      G->pos = iVar3;
                                      G->thunkpos = iVar6;
                                      iVar4 = yy_loose_or_expr(G);
                                      if (iVar4 == 0) {
                                        G->pos = iVar3;
                                        G->thunkpos = iVar6;
                                        iVar9 = 0;
                                      }
                                      else {
                                        yyDo(G,yySet,-3,0,"yySet");
                                        do {
                                          iVar3 = G->pos;
                                          iVar6 = G->thunkpos;
                                          iVar4 = yy_ws(G);
                                        } while (iVar4 != 0);
                                        iVar9 = 0x3b;
                                      }
                                      iVar4 = 0;
                                      G->pos = iVar3;
                                      G->thunkpos = iVar6;
                                      if ((iVar9 != 0x3b) && (iVar9 != 0)) goto LAB_0010870b;
                                      iVar4 = yymatchChar(G,0x29);
                                      if (iVar4 != 0) {
                                        iVar8 = G->begin;
                                        iVar7 = G->end;
                                        pcVar10 = yy_21_term;
                                        pcVar11 = "yy_21_term";
                                        goto LAB_00109127;
                                      }
                                    }
                                    G->pos = iVar8;
                                    G->thunkpos = iVar7;
                                    yyDo(G,yy_22_term,G->begin,G->end,"yy_22_term");
                                    iVar4 = yymatchString(G,"%(");
                                    iVar9 = 0x3c;
                                    if (iVar4 != 0) {
                                      do {
                                        iVar8 = G->pos;
                                        iVar7 = G->thunkpos;
                                        iVar4 = yy_ws(G);
                                      } while (iVar4 != 0);
                                      G->pos = iVar8;
                                      G->thunkpos = iVar7;
                                      iVar4 = yy_loose_or_expr(G);
                                      if (iVar4 == 0) {
                                        G->pos = iVar8;
                                        G->thunkpos = iVar7;
                                        iVar9 = 0;
                                      }
                                      else {
                                        yyDo(G,yySet,-3,0,"yySet");
                                        do {
                                          iVar8 = G->pos;
                                          iVar7 = G->thunkpos;
                                          iVar4 = yy_ws(G);
                                        } while (iVar4 != 0);
                                        iVar9 = 0x3e;
                                      }
                                      iVar4 = 0;
                                      G->pos = iVar8;
                                      G->thunkpos = iVar7;
                                      if ((iVar9 == 0x3e) || (iVar9 == 0)) {
                                        iVar4 = yymatchChar(G,0x29);
                                        iVar9 = 0x3c;
                                        if (iVar4 != 0) {
                                          yyDo(G,yy_23_term,G->begin,G->end,"yy_23_term");
                                          iVar9 = 0;
                                          iVar4 = extraout_EAX_02;
                                        }
                                      }
                                    }
                                    goto LAB_0010870b;
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          do {
                            iVar4 = G->pos;
                            iVar9 = G->thunkpos;
                            iVar3 = yy_ws(G);
                          } while (iVar3 != 0);
                          G->pos = iVar4;
                          G->thunkpos = iVar9;
                          iVar4 = yy_block(G);
                          if (iVar4 == 0) goto LAB_00109047;
                          yyDo(G,yySet,-2,0,"yySet");
                          iVar8 = G->begin;
                          iVar7 = G->end;
                          pcVar10 = yy_5_term;
                          pcVar11 = "yy_5_term";
LAB_00109127:
                          yyDo(G,pcVar10,iVar8,iVar7,pcVar11);
                          iVar4 = extraout_EAX_01;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00108eca:
        iVar9 = 3;
        goto LAB_0010870b;
      }
    }
  }
  else {
    do {
      iVar4 = G->pos;
      iVar9 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)"",pcVar11);
      pcVar11 = extraout_RDX_00;
    } while (iVar3 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar3 = yymatchChar(G,0x2e);
    if (iVar3 != 0) {
      iVar3 = yymatchClass(G,(uchar *)"",cclass_00);
      pcVar11 = extraout_RDX_01;
      while (iVar3 != 0) {
        iVar4 = G->pos;
        iVar9 = G->thunkpos;
        iVar3 = yymatchClass(G,(uchar *)"",pcVar11);
        pcVar11 = extraout_RDX_02;
      }
    }
LAB_00108203:
    G->pos = iVar4;
    G->thunkpos = iVar9;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar4 = yymatchChar(G,0x69);
    if (iVar4 == 0) goto LAB_0010824b;
    iVar8 = G->begin;
    iVar7 = G->end;
    pcVar10 = yy_1_complex;
    pcVar11 = "yy_1_complex";
LAB_00108701:
    yyDo(G,pcVar10,iVar8,iVar7,pcVar11);
    iVar4 = extraout_EAX;
  }
LAB_00108706:
  iVar9 = 3;
LAB_0010870b:
  if (iVar9 != 0) {
    if (iVar9 == 0x3c) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
    if (iVar9 != 3) {
      return iVar4;
    }
  }
  yyDo(G,yyPop,3,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_term(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "term"));

  {  int yypos451= G->pos, yythunkpos451= G->thunkpos;  if (!yy_complex(G))  goto l452;
  goto l451;
  l452:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_integer(G))  goto l453;
  goto l451;
  l453:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_path(G))  goto l454;
  goto l451;
  l454:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_dec_number(G))  goto l455;
  goto l451;
  l455:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_string(G))  goto l456;
  goto l451;
  l456:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '(')) goto l457;
  if (!yy__(G))  goto l457;
  if (!yy_expr(G))  goto l457;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l457;
  if (!yymatchChar(G, ')')) goto l457;
  yyDo(G, yy_1_term, G->begin, G->end, "yy_1_term");
  goto l451;
  l457:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_variable(G))  goto l458;
  goto l451;
  l458:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "$?LINE")) goto l459;
  yyDo(G, yy_2_term, G->begin, G->end, "yy_2_term");
  goto l451;
  l459:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_array(G))  goto l460;
  goto l451;
  l460:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_class(G))  goto l461;
  goto l451;
  l461:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_role(G))  goto l462;
  goto l451;
  l462:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_funcall(G))  goto l463;
  goto l451;
  l463:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_qw(G))  goto l464;
  goto l451;
  l464:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_hash(G))  goto l465;
  goto l451;
  l465:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_lambda(G))  goto l466;
  goto l451;
  l466:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_it_method(G))  goto l467;
  goto l451;
  l467:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_enum(G))  goto l468;
  goto l451;
  l468:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "pi")) goto l469;

  {  int yypos470= G->pos, yythunkpos470= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l470;
  goto l469;
  l470:;	  G->pos= yypos470; G->thunkpos= yythunkpos470;
  }  yyDo(G, yy_3_term, G->begin, G->end, "yy_3_term");
  goto l451;
  l469:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, 'e')) goto l471;

  {  int yypos472= G->pos, yythunkpos472= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l472;
  goto l471;
  l472:;	  G->pos= yypos472; G->thunkpos= yythunkpos472;
  }  yyDo(G, yy_4_term, G->begin, G->end, "yy_4_term");
  goto l451;
  l471:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "try")) goto l473;
  if (!yy_ws(G))  goto l473;
  if (!yy__(G))  goto l473;
  if (!yy_block(G))  goto l473;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_5_term, G->begin, G->end, "yy_5_term");
  goto l451;
  l473:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "try")) goto l474;
  if (!yy_ws(G))  goto l474;

  l475:;	
  {  int yypos476= G->pos, yythunkpos476= G->thunkpos;  if (!yy_ws(G))  goto l476;
  goto l475;
  l476:;	  G->pos= yypos476; G->thunkpos= yythunkpos476;
  }  if (!yy_expr(G))  goto l474;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_6_term, G->begin, G->end, "yy_6_term");
  goto l451;
  l474:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_perl5_regexp(G))  goto l477;
  goto l451;
  l477:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "m:P5/./")) goto l478;
  yyDo(G, yy_7_term, G->begin, G->end, "yy_7_term");
  goto l451;
  l478:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_regexp(G))  goto l479;
  goto l451;
  l479:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "True")) goto l480;

  {  int yypos481= G->pos, yythunkpos481= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l481;
  goto l480;
  l481:;	  G->pos= yypos481; G->thunkpos= yythunkpos481;
  }  yyDo(G, yy_8_term, G->begin, G->end, "yy_8_term");
  goto l451;
  l480:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "False")) goto l482;

  {  int yypos483= G->pos, yythunkpos483= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l483;
  goto l482;
  l483:;	  G->pos= yypos483; G->thunkpos= yythunkpos483;
  }  yyDo(G, yy_9_term, G->begin, G->end, "yy_9_term");
  goto l451;
  l482:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;
  {  int yypos485= G->pos, yythunkpos485= G->thunkpos;  if (!yy_reserved(G))  goto l485;
  goto l484;
  l485:;	  G->pos= yypos485; G->thunkpos= yythunkpos485;
  }  if (!yy_ident(G))  goto l484;
  goto l451;
  l484:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l486;  if (!yymatchString(G, "class")) goto l486;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l486;  yyDo(G, yy_10_term, G->begin, G->end, "yy_10_term");
  goto l451;
  l486:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_pair(G))  goto l487;
  goto l451;
  l487:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '\\')) goto l488;
  if (!yy_term(G))  goto l488;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_11_term, G->begin, G->end, "yy_11_term");
  goto l451;
  l488:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '(')) goto l489;
  if (!yy__(G))  goto l489;
  if (!yymatchChar(G, ')')) goto l489;
  yyDo(G, yy_12_term, G->begin, G->end, "yy_12_term");
  goto l451;
  l489:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_funcref(G))  goto l490;
  goto l451;
  l490:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l491;  if (!yymatchString(G, "$~")) goto l491;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z")) goto l491;

  l492:;	
  {  int yypos493= G->pos, yythunkpos493= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z0-9")) goto l493;
  goto l492;
  l493:;	  G->pos= yypos493; G->thunkpos= yythunkpos493;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l491;  yyDo(G, yy_13_term, G->begin, G->end, "yy_13_term");
  goto l451;
  l491:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '*')) goto l494;

  {  int yypos495= G->pos, yythunkpos495= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\004\000\040\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "*=")) goto l495;
  goto l494;
  l495:;	  G->pos= yypos495; G->thunkpos= yythunkpos495;
  }  yyDo(G, yy_14_term, G->begin, G->end, "yy_14_term");
  goto l451;
  l494:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_attr_vars(G))  goto l496;
  goto l451;
  l496:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "rand")) goto l497;

  {  int yypos498= G->pos, yythunkpos498= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l498;
  goto l497;
  l498:;	  G->pos= yypos498; G->thunkpos= yythunkpos498;
  }  yyDo(G, yy_15_term, G->begin, G->end, "yy_15_term");
  goto l451;
  l497:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "now")) goto l499;

  {  int yypos500= G->pos, yythunkpos500= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l500;
  goto l499;
  l500:;	  G->pos= yypos500; G->thunkpos= yythunkpos500;
  }  yyDo(G, yy_16_term, G->begin, G->end, "yy_16_term");
  goto l451;
  l499:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "time")) goto l501;

  {  int yypos502= G->pos, yythunkpos502= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l502;
  goto l501;
  l502:;	  G->pos= yypos502; G->thunkpos= yythunkpos502;
  }  yyDo(G, yy_17_term, G->begin, G->end, "yy_17_term");
  goto l451;
  l501:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_18_term, G->begin, G->end, "yy_18_term");
  if (!yymatchString(G, "$(")) goto l503;
  if (!yy__(G))  goto l503;

  {  int yypos504= G->pos, yythunkpos504= G->thunkpos;  if (!yy_expr(G))  goto l504;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l504;
  goto l505;
  l504:;	  G->pos= yypos504; G->thunkpos= yythunkpos504;
  }
  l505:;	  if (!yymatchChar(G, ')')) goto l503;
  yyDo(G, yy_19_term, G->begin, G->end, "yy_19_term");
  goto l451;
  l503:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_20_term, G->begin, G->end, "yy_20_term");
  if (!yymatchString(G, "@(")) goto l506;
  if (!yy__(G))  goto l506;

  {  int yypos507= G->pos, yythunkpos507= G->thunkpos;  if (!yy_expr(G))  goto l507;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l507;
  goto l508;
  l507:;	  G->pos= yypos507; G->thunkpos= yythunkpos507;
  }
  l508:;	  if (!yymatchChar(G, ')')) goto l506;
  yyDo(G, yy_21_term, G->begin, G->end, "yy_21_term");
  goto l451;
  l506:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_22_term, G->begin, G->end, "yy_22_term");
  if (!yymatchString(G, "%(")) goto l450;
  if (!yy__(G))  goto l450;

  {  int yypos509= G->pos, yythunkpos509= G->thunkpos;  if (!yy_expr(G))  goto l509;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l509;
  goto l510;
  l509:;	  G->pos= yypos509; G->thunkpos= yythunkpos509;
  }
  l510:;	  if (!yymatchChar(G, ')')) goto l450;
  yyDo(G, yy_23_term, G->begin, G->end, "yy_23_term");

  }
  l451:;	  yyprintf((stderr, "  ok   term"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l450:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "term"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}